

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> * __thiscall
cmCTest::Private::GetTestingHandlers
          (vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
           *__return_storage_ptr__,Private *this)

{
  initializer_list<cmCTestGenericHandler_*> __l;
  allocator_type local_59;
  cmCTestGenericHandler *local_58;
  cmCTestBuildAndTestHandler *local_50;
  cmCTestCoverageHandler *local_48;
  cmCTestScriptHandler *local_40;
  cmCTestTestHandler *local_38;
  cmCTestUpdateHandler *local_30;
  cmCTestConfigureHandler *local_28;
  cmCTestMemCheckHandler *local_20;
  cmCTestSubmitHandler *local_18;
  cmCTestUploadHandler *local_10;
  
  local_58 = &(this->BuildHandler).super_cmCTestGenericHandler;
  local_50 = &this->BuildAndTestHandler;
  local_48 = &this->CoverageHandler;
  local_40 = &this->ScriptHandler;
  local_38 = &this->TestHandler;
  local_30 = &this->UpdateHandler;
  local_28 = &this->ConfigureHandler;
  local_20 = &this->MemCheckHandler;
  local_18 = &this->SubmitHandler;
  local_10 = &this->UploadHandler;
  __l._M_len = 10;
  __l._M_array = &local_58;
  std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::vector
            (__return_storage_ptr__,__l,&local_59);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmCTestGenericHandler*> GetTestingHandlers()
  {
    return { &this->BuildHandler,     &this->BuildAndTestHandler,
             &this->CoverageHandler,  &this->ScriptHandler,
             &this->TestHandler,      &this->UpdateHandler,
             &this->ConfigureHandler, &this->MemCheckHandler,
             &this->SubmitHandler,    &this->UploadHandler };
  }